

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ptl.cpp
# Opt level: O2

void __thiscall pg::PTLSolver::run(PTLSolver *this)

{
  pointer ppiVar1;
  vector<int,_std::allocator<int>_> *pvVar2;
  pointer piVar3;
  undefined1 auVar4 [16];
  ulong uVar5;
  ulong uVar6;
  ulong *puVar7;
  int *piVar8;
  uint *puVar9;
  uint *puVar10;
  ostream *poVar11;
  ulong uVar12;
  ulong uVar13;
  Game *pGVar14;
  long lVar15;
  int **x;
  pointer ppiVar16;
  
  this->iterations = 0;
  this->dominions = 0;
  this->tangles = 0;
  uVar12 = ((this->super_Solver).game)->n_vertices;
  auVar4._8_8_ = 0;
  auVar4._0_8_ = uVar12;
  uVar6 = SUB168(auVar4 * ZEXT816(0x18),0);
  uVar5 = 0xffffffffffffffff;
  uVar13 = uVar6 + 8;
  if (0xfffffffffffffff7 < uVar6) {
    uVar13 = uVar5;
  }
  if (SUB168(auVar4 * ZEXT816(0x18),8) != 0) {
    uVar13 = uVar5;
  }
  puVar7 = (ulong *)operator_new__(uVar13);
  *puVar7 = uVar12;
  if (uVar12 != 0) {
    memset((vector<int,_std::allocator<int>_> *)(puVar7 + 1),0,
           ((uVar6 - 0x18) - (uVar6 - 0x18) % 0x18) + 0x18);
  }
  this->tin = (vector<int,_std::allocator<int>_> *)(puVar7 + 1);
  piVar8 = (int *)operator_new__(-(ulong)(uVar12 >> 0x3e != 0) | uVar12 << 2);
  this->str = piVar8;
  bitset::resize(&this->H,uVar12);
  bitset::resize(&this->S0,((this->super_Solver).game)->n_vertices);
  bitset::resize(&this->S1,((this->super_Solver).game)->n_vertices);
  bitset::operator=(&this->G,(this->super_Solver).disabled);
  bitset::flip(&this->G);
  pGVar14 = (this->super_Solver).game;
  puVar9 = (this->Q).queue;
  uVar12 = pGVar14->n_vertices;
  (this->Q).pointer = 0;
  if (puVar9 != (uint *)0x0) {
    operator_delete__(puVar9);
    pGVar14 = (this->super_Solver).game;
  }
  puVar9 = (uint *)operator_new__((uVar12 & 0xffffffff) << 2);
  (this->Q).queue = puVar9;
  uVar12 = pGVar14->n_vertices;
  (this->SolvedQ0).pointer = 0;
  puVar9 = (this->SolvedQ0).queue;
  if (puVar9 != (uint *)0x0) {
    operator_delete__(puVar9);
    pGVar14 = (this->super_Solver).game;
  }
  puVar9 = (uint *)operator_new__((uVar12 & 0xffffffff) << 2);
  (this->SolvedQ0).queue = puVar9;
  uVar12 = pGVar14->n_vertices;
  (this->SolvedQ1).pointer = 0;
  puVar9 = (this->SolvedQ1).queue;
  if (puVar9 != (uint *)0x0) {
    operator_delete__(puVar9);
    pGVar14 = (this->super_Solver).game;
  }
  puVar9 = (uint *)operator_new__((uVar12 & 0xffffffff) << 2);
  (this->SolvedQ1).queue = puVar9;
  uVar12 = pGVar14->n_vertices;
  (this->Zvec).pointer = 0;
  puVar9 = (this->Zvec).queue;
  if (puVar9 != (uint *)0x0) {
    operator_delete__(puVar9);
    pGVar14 = (this->super_Solver).game;
  }
  puVar9 = (uint *)operator_new__((uVar12 & 0xffffffff) << 2);
  (this->Zvec).queue = puVar9;
  uVar12 = pGVar14->n_vertices;
  (this->tangleto).pointer = 0;
  puVar9 = (this->tangleto).queue;
  if (puVar9 != (uint *)0x0) {
    operator_delete__(puVar9);
    pGVar14 = (this->super_Solver).game;
  }
  puVar9 = (uint *)operator_new__((uVar12 & 0xffffffff) << 2);
  (this->tangleto).queue = puVar9;
  bitset::resize(&this->bs_exits,pGVar14->n_vertices);
  pGVar14 = (this->super_Solver).game;
  puVar9 = (this->pea_vS).queue;
  uVar12 = pGVar14->n_vertices;
  (this->pea_vS).pointer = 0;
  if (puVar9 != (uint *)0x0) {
    operator_delete__(puVar9);
    pGVar14 = (this->super_Solver).game;
  }
  puVar9 = (uint *)operator_new__((uVar12 & 0xffffffff) << 2);
  (this->pea_vS).queue = puVar9;
  uVar12 = pGVar14->n_vertices;
  (this->pea_iS).pointer = 0;
  puVar9 = (this->pea_iS).queue;
  if (puVar9 != (uint *)0x0) {
    operator_delete__(puVar9);
    pGVar14 = (this->super_Solver).game;
  }
  puVar9 = (uint *)operator_new__((uVar12 & 0xffffffff) << 2);
  (this->pea_iS).queue = puVar9;
  uVar12 = pGVar14->n_vertices;
  (this->pea_S).pointer = 0;
  puVar9 = (this->pea_S).queue;
  if (puVar9 != (uint *)0x0) {
    operator_delete__(puVar9);
    pGVar14 = (this->super_Solver).game;
  }
  puVar9 = (uint *)operator_new__((uVar12 & 0xffffffff) << 2);
  (this->pea_S).queue = puVar9;
  uVar12 = pGVar14->n_vertices * 4;
  if (0x3fffffffffffffff < (ulong)pGVar14->n_vertices) {
    uVar12 = uVar5;
  }
  puVar10 = (uint *)operator_new__(uVar12);
  this->pea_vidx = puVar10;
  bitset::resize(&this->pea_root,pGVar14->n_vertices);
  solve(this);
  poVar11 = std::operator<<((this->super_Solver).logger,"found ");
  poVar11 = (ostream *)std::ostream::operator<<(poVar11,this->dominions);
  poVar11 = std::operator<<(poVar11," dominions.");
  std::endl<char,std::char_traits<char>>(poVar11);
  poVar11 = std::operator<<((this->super_Solver).logger,"solved with ");
  poVar11 = (ostream *)std::ostream::operator<<(poVar11,this->tangles);
  poVar11 = std::operator<<(poVar11," tangles and ");
  poVar11 = (ostream *)std::ostream::operator<<(poVar11,this->iterations);
  poVar11 = std::operator<<(poVar11," iterations.");
  std::endl<char,std::char_traits<char>>(poVar11);
  uVar5 = ((this->super_Solver).game)->n_vertices;
  uVar12 = 0;
  while ((~((long)uVar5 >> 0x3f) & uVar5) != uVar12) {
    uVar6 = uVar12 >> 6;
    uVar13 = uVar12 & 0x3f;
    uVar12 = uVar12 + 1;
    if ((((this->super_Solver).disabled)->_bits[uVar6] >> uVar13 & 1) == 0) {
      poVar11 = std::operator<<((this->super_Solver).logger,"search was incomplete!");
      std::endl<char,std::char_traits<char>>(poVar11);
      exit(-1);
    }
  }
  ppiVar1 = (this->tv).super__Vector_base<int_*,_std::allocator<int_*>_>._M_impl.
            super__Vector_impl_data._M_finish;
  for (ppiVar16 = (this->tv).super__Vector_base<int_*,_std::allocator<int_*>_>._M_impl.
                  super__Vector_impl_data._M_start; ppiVar16 != ppiVar1; ppiVar16 = ppiVar16 + 1) {
    if (*ppiVar16 != (int *)0x0) {
      operator_delete__(*ppiVar16);
    }
  }
  ppiVar1 = (this->tout).super__Vector_base<int_*,_std::allocator<int_*>_>._M_impl.
            super__Vector_impl_data._M_finish;
  for (ppiVar16 = (this->tout).super__Vector_base<int_*,_std::allocator<int_*>_>._M_impl.
                  super__Vector_impl_data._M_start; ppiVar16 != ppiVar1; ppiVar16 = ppiVar16 + 1) {
    if (*ppiVar16 != (int *)0x0) {
      operator_delete__(*ppiVar16);
    }
  }
  pvVar2 = this->tin;
  if (pvVar2 != (vector<int,_std::allocator<int>_> *)0x0) {
    piVar3 = pvVar2[-1].super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_end_of_storage;
    if (piVar3 != (pointer)0x0) {
      lVar15 = (long)piVar3 * 0x18;
      do {
        std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
                  ((_Vector_base<int,_std::allocator<int>_> *)
                   ((long)&pvVar2[-1].super__Vector_base<int,_std::allocator<int>_>._M_impl.
                           super__Vector_impl_data._M_start + lVar15));
        lVar15 = lVar15 + -0x18;
      } while (lVar15 != 0);
    }
    operator_delete__(&pvVar2[-1].super__Vector_base<int,_std::allocator<int>_>._M_impl.
                       super__Vector_impl_data._M_end_of_storage,(long)piVar3 * 0x18 + 8);
  }
  if (this->str != (int *)0x0) {
    operator_delete__(this->str);
  }
  if (this->pea_vidx != (uint *)0x0) {
    operator_delete__(this->pea_vidx);
    return;
  }
  return;
}

Assistant:

void
PTLSolver::run()
{
    iterations = 0;
    dominions = 0;
    tangles = 0;

    tin = new std::vector<int>[nodecount()];
    str = new int[nodecount()];

    H.resize(nodecount());
    S0.resize(nodecount());
    S1.resize(nodecount());
    G = disabled;
    G.flip();

    Q.resize(nodecount());
    SolvedQ0.resize(nodecount());
    SolvedQ1.resize(nodecount());
    Zvec.resize(nodecount());
    tangleto.resize(nodecount());
    bs_exits.resize(nodecount());

    pea_vS.resize(nodecount());
    pea_iS.resize(nodecount());
    pea_S.resize(nodecount());
    pea_vidx = new unsigned int[nodecount()];
    pea_root.resize(nodecount());

    solve();

    logger << "found " << dominions << " dominions." << std::endl;
    logger << "solved with " << tangles << " tangles and " << iterations << " iterations." << std::endl;

    // check if actually all solved
#ifndef NDEBUG
    for (int i=0; i<nodecount(); i++) {
        if (!disabled[i]) { logger << "search was incomplete!" << std::endl; exit(-1); }
    }
#endif

    // delete[] tangles
    for (auto &x : tv) delete[] x;
    for (auto &x : tout) delete[] x;
    delete[] tin;
    delete[] str;
    delete[] pea_vidx;
}